

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboRenderTest.cpp
# Opt level: O3

void deqp::gles2::Functional::checkColorFormatSupport(Context *context,deUint32 sizedFormat)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  istream *piVar3;
  NotSupportedError *this;
  istringstream extensions;
  allocator<char> local_1c9;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8;
  undefined7 uStack_1b7;
  string local_1a8 [3];
  ios_base local_130 [264];
  
  if (((sizedFormat - 0x881a < 2) || (sizedFormat == 0x822f)) || (sizedFormat == 0x822d)) {
    iVar2 = (*context->_vptr_Context[0x7c])(context,0x1f03);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,(char *)CONCAT44(extraout_var,iVar2),&local_1c9);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1a8,(string *)&local_1c8,_S_in);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
    }
    local_1c0 = 0;
    local_1b8 = 0;
    local_1c8 = &local_1b8;
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_1a8,(string *)&local_1c8,' ');
      uVar1 = *(uint *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18) + 0x20);
      if ((uVar1 & 5) != 0) break;
      iVar2 = std::__cxx11::string::compare((char *)&local_1c8);
    } while (iVar2 != 0);
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,CONCAT71(uStack_1b7,local_1b8) + 1);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1a8);
    std::ios_base::~ios_base(local_130);
    if ((uVar1 & 5) != 0) {
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"GL_EXT_color_buffer_half_float is not supported","");
      tcu::NotSupportedError::NotSupportedError(this,local_1a8);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  return;
}

Assistant:

static void checkColorFormatSupport (sglr::Context& context, deUint32 sizedFormat)
{
	switch (sizedFormat)
	{
		case GL_RGBA16F:
		case GL_RGB16F:
		case GL_RG16F:
		case GL_R16F:
			if (!isExtensionSupported(context, "GL_EXT_color_buffer_half_float"))
				throw tcu::NotSupportedError("GL_EXT_color_buffer_half_float is not supported");

		default:
			break;
	}
}